

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O2

int phits_ensure_load(phits_fileinternal_t *f,int nbytes)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (nbytes < 0x79) {
    iVar2 = nbytes - f->lbuf;
    if (0 < iVar2) {
      iVar1 = mcpl_generic_fread_try(f,f->buf + f->lbuf,iVar2);
      if (iVar1 != iVar2) {
        return 0;
      }
      f->lbuf = nbytes;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int phits_ensure_load(phits_fileinternal_t* f, int nbytes)
{
  //For slowly filling up f->buf while reading first record. Returns 1 in case
  //of success.
  if ( nbytes > (int)PHITSREAD_MAXBUFSIZE )
    return 0;
  int missing = nbytes - f->lbuf;
  if ( missing<=0 )
    return 1;
  int actual = (int)mcpl_generic_fread_try( &f->filehandle,
                                            &(f->buf[f->lbuf]),
                                            (unsigned)missing );
  //int nr = phits_readbytes(f,&(f->buf[f->lbuf]),missing);
  if (actual!=missing)
    return 0;
  f->lbuf = nbytes;
  return 1;
}